

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O1

void __thiscall
irr::video::CNullDriver::draw2DImageBatch
          (CNullDriver *this,ITexture *texture,array<irr::core::vector2d<int>_> *positions,
          array<irr::core::rect<int>_> *sourceRects,rect<int> *clipRect,SColor color,
          bool useAlphaChannelOfTexture)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = (uint)((ulong)((long)(positions->m_data).
                               super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(positions->m_data).
                              super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  uVar1 = (uint)((ulong)((long)(sourceRects->m_data).
                               super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(sourceRects->m_data).
                              super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (uVar2 < uVar1) {
    uVar1 = uVar2;
  }
  if (uVar1 != 0) {
    uVar3 = 0;
    do {
      (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x30])
                (this,texture,
                 (positions->m_data).
                 super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar3,
                 (sourceRects->m_data).
                 super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar3,clipRect,(ulong)color.color,
                 (uint)useAlphaChannelOfTexture);
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar1);
  }
  return;
}

Assistant:

void CNullDriver::draw2DImageBatch(const video::ITexture *texture,
		const core::array<core::position2d<s32>> &positions,
		const core::array<core::rect<s32>> &sourceRects,
		const core::rect<s32> *clipRect,
		SColor color,
		bool useAlphaChannelOfTexture)
{
	const irr::u32 drawCount = core::min_<u32>(positions.size(), sourceRects.size());

	for (u32 i = 0; i < drawCount; ++i) {
		draw2DImage(texture, positions[i], sourceRects[i],
				clipRect, color, useAlphaChannelOfTexture);
	}
}